

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

State * __thiscall duckdb_re2::DFA::RunStateOnByte(DFA *this,State *state,int c)

{
  uint32_t flag;
  uint32_t uVar1;
  State *pSVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Workq *pWVar6;
  Workq *pWVar7;
  uint flag_00;
  byte bVar8;
  bool bVar9;
  bool ismatch;
  bool local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (state < (State *)&DAT_00000003) {
    if (state == (State *)0x0) {
      local_1b0[0] = false;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"NULL state in RunStateOnByte",0x1c);
    }
    else {
      if (state == (State *)&DAT_00000002) {
        return (State *)&DAT_00000002;
      }
      if (state == (State *)0x1) {
        local_1b0[0] = false;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"DeadState in RunStateOnByte",0x1b);
      }
      else {
        local_1b0[0] = false;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unexpected special state in RunStateOnByte",0x2a);
      }
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    pSVar2 = (State *)0x0;
  }
  else {
    if (c == 0x100) {
      uVar5 = this->prog_->bytemap_range_;
    }
    else {
      uVar5 = (uint)this->prog_->bytemap_[c];
    }
    pSVar2 = state->next_[(int)uVar5]._M_b._M_p;
    if (pSVar2 == (State *)0x0) {
      StateToWorkq(this,state,this->q0_);
      uVar5 = state->flag_;
      uVar4 = uVar5 & 0xff;
      uVar3 = uVar4 | 2;
      if (c != 10) {
        uVar3 = uVar4;
      }
      if (c == 0x100) {
        bVar9 = false;
        uVar3 = uVar3 | 10;
      }
      else {
        bVar8 = (byte)c;
        bVar9 = (bVar8 == 0x5f || (byte)(bVar8 - 0x30) < 10) || (byte)((bVar8 & 0xdf) + 0xbf) < 0x1a
        ;
      }
      flag_00 = (uint)(c == 10);
      uVar3 = (uint)(byte)((uVar5 >> 9 & 1) == 0 ^ bVar9) * 0x10 + 0x10 | uVar3;
      pWVar7 = this->q0_;
      pWVar6 = this->q1_;
      if ((uVar5 >> 0x10 & ~uVar4 & uVar3) != 0) {
        RunWorkqOnEmptyString(this,pWVar7,pWVar6,uVar3);
        pWVar6 = this->q0_;
        pWVar7 = this->q1_;
        this->q0_ = pWVar7;
        this->q1_ = pWVar6;
      }
      local_1b0[0] = false;
      RunWorkqOnByte(this,pWVar7,pWVar6,c,flag_00,local_1b0);
      pWVar7 = this->q0_;
      pWVar6 = this->q1_;
      this->q0_ = pWVar6;
      this->q1_ = pWVar7;
      if (this->kind_ != kManyMatch) {
        pWVar7 = (Workq *)0x0;
      }
      uVar1 = flag_00 | 0x100;
      if (local_1b0[0] == false) {
        pWVar7 = (Workq *)0x0;
        uVar1 = flag_00;
      }
      flag = uVar1 + 0x200;
      if (bVar9 == false) {
        flag = uVar1;
      }
      pSVar2 = WorkqToCachedState(this,pWVar6,pWVar7,flag);
      if (c == 0x100) {
        uVar5 = this->prog_->bytemap_range_;
      }
      else {
        uVar5 = (uint)this->prog_->bytemap_[c];
      }
      state->next_[(int)uVar5]._M_b._M_p = pSVar2;
    }
  }
  return pSVar2;
}

Assistant:

DFA::State* DFA::RunStateOnByte(State* state, int c) {
  //mutex_.AssertHeld();

  if (state <= SpecialStateMax) {
    if (state == FullMatchState) {
      // It is convenient for routines like PossibleMatchRange
      // if we implement RunStateOnByte for FullMatchState:
      // once you get into this state you never get out,
      // so it's pretty easy.
      return FullMatchState;
    }
    if (state == DeadState) {
      LOG(DFATAL) << "DeadState in RunStateOnByte";
      return NULL;
    }
    if (state == NULL) {
      LOG(DFATAL) << "NULL state in RunStateOnByte";
      return NULL;
    }
    LOG(DFATAL) << "Unexpected special state in RunStateOnByte";
    return NULL;
  }

  // If someone else already computed this, return it.
  State* ns = state->next_[ByteMap(c)].load(std::memory_order_relaxed);
  if (ns != NULL)
    return ns;

  // Convert state into Workq.
  StateToWorkq(state, q0_);

  // Flags marking the kinds of empty-width things (^ $ etc)
  // around this byte.  Before the byte we have the flags recorded
  // in the State structure itself.  After the byte we have
  // nothing yet (but that will change: read on).
  uint32_t needflag = state->flag_ >> kFlagNeedShift;
  uint32_t beforeflag = state->flag_ & kFlagEmptyMask;
  uint32_t oldbeforeflag = beforeflag;
  uint32_t afterflag = 0;

  if (c == '\n') {
    // Insert implicit $ and ^ around \n
    beforeflag |= kEmptyEndLine;
    afterflag |= kEmptyBeginLine;
  }

  if (c == kByteEndText) {
    // Insert implicit $ and \z before the fake "end text" byte.
    beforeflag |= kEmptyEndLine | kEmptyEndText;
  }

  // The state flag kFlagLastWord says whether the last
  // byte processed was a word character.  Use that info to
  // insert empty-width (non-)word boundaries.
  bool islastword = (state->flag_ & kFlagLastWord) != 0;
  bool isword = c != kByteEndText && Prog::IsWordChar(static_cast<uint8_t>(c));
  if (isword == islastword)
    beforeflag |= kEmptyNonWordBoundary;
  else
    beforeflag |= kEmptyWordBoundary;

  // Okay, finally ready to run.
  // Only useful to rerun on empty string if there are new, useful flags.
  if (beforeflag & ~oldbeforeflag & needflag) {
    RunWorkqOnEmptyString(q0_, q1_, beforeflag);
    using std::swap;
    swap(q0_, q1_);
  }
  bool ismatch = false;
  RunWorkqOnByte(q0_, q1_, c, afterflag, &ismatch);
  using std::swap;
  swap(q0_, q1_);

  // Save afterflag along with ismatch and isword in new state.
  uint32_t flag = afterflag;
  if (ismatch)
    flag |= kFlagMatch;
  if (isword)
    flag |= kFlagLastWord;

  if (ismatch && kind_ == Prog::kManyMatch)
    ns = WorkqToCachedState(q0_, q1_, flag);
  else
    ns = WorkqToCachedState(q0_, NULL, flag);

  // Flush ns before linking to it.
  // Write barrier before updating state->next_ so that the
  // main search loop can proceed without any locking, for speed.
  // (Otherwise it would need one mutex operation per input byte.)
  state->next_[ByteMap(c)].store(ns, std::memory_order_release);
  return ns;
}